

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIHexDecoder::decode(FIHexDecoder *this,uint8_t *data,size_t len)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  FIHexDecoder FVar1;
  long in_RCX;
  shared_ptr<const_Assimp::FIValue> sVar2;
  allocator_type local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_28,(uchar *)len,
             (uchar *)(in_RCX + len),&local_29);
  FVar1 = (FIHexDecoder)operator_new(0x58);
  *(undefined8 *)((long)FVar1 + 8) = 0x100000001;
  *(undefined ***)FVar1 = &PTR___Sp_counted_ptr_inplace_008bffd8;
  *(undefined ***)((long)FVar1 + 0x10) = &PTR_toString_abi_cxx11__008c0028;
  *(undefined8 **)((long)FVar1 + 0x30) = (undefined8 *)((long)FVar1 + 0x40);
  *(undefined8 *)((long)FVar1 + 0x38) = 0;
  *(undefined1 *)((long)FVar1 + 0x40) = 0;
  *(undefined1 *)((long)FVar1 + 0x50) = 0;
  *(undefined8 *)((long)FVar1 + 0x18) = local_28;
  *(undefined8 *)((long)FVar1 + 0x20) = uStack_20;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)FVar1 + 0x28) = local_18._M_pi;
  *this = (FIHexDecoder)((long)FVar1 + 0x10);
  this[1] = FVar1;
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_18._M_pi;
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FIHexValue::create(std::vector<uint8_t>(data, data + len));
    }